

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O1

mi_segment_t *
mi_segment_alloc(size_t required,size_t page_alignment,mi_arena_id_t req_arena_id,
                mi_segments_tld_t *tld,mi_page_t **huge_page)

{
  mi_memid_t memid_00;
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  mi_segment_t *segment;
  ulong *puVar4;
  long lVar5;
  mi_threadid_t mVar6;
  mi_page_t *pmVar7;
  ulong uVar8;
  mi_segment_t *pmVar9;
  size_t size;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  _Bool _Var13;
  size_t info_slices;
  mi_memid_t memid;
  mi_commit_mask_t commit_mask;
  ulong local_b8;
  mi_arena_id_t local_ac;
  size_t local_a8;
  anon_union_16_2_8cef793c_for_mem local_a0;
  byte local_90;
  char cStack_8f;
  undefined6 uStack_8e;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  mi_page_t **local_40;
  size_t local_38;
  
  local_ac = req_arena_id;
  sVar1 = mi_segment_calculate_slices(required,&local_b8);
  sVar2 = _mi_current_thread_count();
  local_40 = huge_page;
  if (sVar2 < 2) {
    bVar12 = false;
  }
  else {
    uVar10 = tld->peak_count;
    uVar3 = mi_option_get(mi_option_eager_commit_delay);
    bVar12 = uVar10 < uVar3;
  }
  if (bVar12 == false) {
    _Var13 = mi_option_is_enabled(mi_option_eager_commit);
  }
  else {
    _Var13 = false;
  }
  local_38 = required;
  if (page_alignment == 0) {
    page_alignment = 0x2000000;
    sVar2 = 0;
  }
  else {
    sVar2 = local_b8 * 0x10000 + 0x1ffffff & 0xfffffffffe000000;
    sVar1 = mi_segment_calculate_slices(required + local_b8 * -0x10000 + sVar2,&local_b8);
  }
  size = sVar1 << 0x10;
  local_a8 = sVar1;
  segment = (mi_segment_t *)
            _mi_arena_alloc_aligned
                      (size,page_alignment,sVar2,(_Bool)(required != 0 | _Var13),(_Bool)(bVar12 ^ 1)
                       ,local_ac,(mi_memid_t *)&local_a0.os);
  if (segment == (mi_segment_t *)0x0) {
    segment = (mi_segment_t *)0x0;
    goto LAB_004af3d5;
  }
  if (cStack_8f == '\x01') {
    local_58._8_4_ = 0xffffffff;
    local_58._0_8_ = 0xffffffffffffffff;
    local_58._12_4_ = 0xffffffff;
    local_68._8_4_ = 0xffffffff;
    local_68._0_8_ = 0xffffffffffffffff;
    local_68._12_4_ = 0xffffffff;
    local_78._8_4_ = 0xffffffff;
    local_78._0_8_ = 0xffffffffffffffff;
    local_78._12_4_ = 0xffffffff;
    local_88._8_4_ = 0xffffffff;
    local_88._0_8_ = 0xffffffffffffffff;
    local_88._12_4_ = 0xffffffff;
  }
  else {
    uVar10 = local_b8 & 0xffffffffffff;
    if (uVar10 == 0) {
      local_58._0_4_ = 0;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
LAB_004af277:
      local_68._4_4_ = local_58._4_4_;
      local_68._0_4_ = local_58._0_4_;
      local_68._8_4_ = local_58._8_4_;
      local_68._12_4_ = local_58._12_4_;
      local_78._4_4_ = local_58._4_4_;
      local_78._0_4_ = local_58._0_4_;
      local_78._8_4_ = local_58._8_4_;
      local_78._12_4_ = local_58._12_4_;
      local_88._4_4_ = local_58._4_4_;
      local_88._0_4_ = local_58._0_4_;
      local_88._8_4_ = local_58._8_4_;
      local_88._12_4_ = local_58._12_4_;
    }
    else {
      if (uVar10 == 0x200) {
        local_58._12_4_ = 0xffffffff;
        local_58._0_4_ = 0xffffffff;
        local_58._4_4_ = 0xffffffff;
        local_58._8_4_ = 0xffffffff;
        goto LAB_004af277;
      }
      puVar4 = (ulong *)local_88;
      local_58 = (undefined1  [16])0x0;
      local_68 = (undefined1  [16])0x0;
      local_78 = (undefined1  [16])0x0;
      local_88 = (undefined1  [16])0x0;
      uVar3 = uVar10;
      do {
        uVar8 = 0x40;
        if (uVar3 < 0x40) {
          uVar8 = uVar3;
        }
        uVar11 = ~(-1L << ((byte)uVar8 & 0x3f));
        if (0x3f < uVar3) {
          uVar11 = 0xffffffffffffffff;
        }
        *puVar4 = uVar11;
        puVar4 = puVar4 + 1;
        uVar3 = uVar3 - uVar8;
      } while (uVar3 != 0);
    }
    _Var13 = _mi_os_commit(segment,uVar10 << 0x10,(_Bool *)0x0);
    if (!_Var13) {
      memid_00.initially_committed = (_Bool)cStack_8f;
      memid_00.is_pinned = (_Bool)local_90;
      memid_00.initially_zero = (_Bool)(undefined1)uStack_8e;
      memid_00._19_1_ = uStack_8e._1_1_;
      memid_00.memkind = uStack_8e._2_4_;
      memid_00.mem.os.size = local_a0.os.size;
      memid_00.mem.os.base = local_a0.os.base;
      _mi_arena_free(segment,size,0,memid_00);
      segment = (mi_segment_t *)0x0;
      goto LAB_004af3d5;
    }
  }
  (segment->memid).is_pinned = (_Bool)local_90;
  (segment->memid).initially_committed = (_Bool)cStack_8f;
  (segment->memid).initially_zero = (_Bool)(char)uStack_8e;
  (segment->memid).field_0x13 = (char)((uint6)uStack_8e >> 8);
  (segment->memid).memkind = (int)((uint6)uStack_8e >> 0x10);
  (segment->memid).mem.os.base = local_a0.os.base;
  (segment->memid).mem.os.size = local_a0.os.size;
  segment->allow_decommit = (_Bool)(local_90 ^ 1);
  if (local_90 == 0) {
    lVar5 = mi_option_get(mi_option_purge_delay);
    _Var13 = -1 < lVar5;
  }
  else {
    _Var13 = false;
  }
  segment->allow_purge = _Var13;
  segment->segment_size = size;
  segment->subproc = tld->subproc;
  (segment->commit_mask).mask[0] = local_88._0_8_;
  (segment->commit_mask).mask[1] = local_88._8_8_;
  (segment->commit_mask).mask[2] = local_78._0_8_;
  (segment->commit_mask).mask[3] = local_78._8_8_;
  (segment->commit_mask).mask[4] = local_68._0_8_;
  (segment->commit_mask).mask[5] = local_68._8_8_;
  (segment->commit_mask).mask[6] = local_58._0_8_;
  (segment->commit_mask).mask[7] = local_58._8_8_;
  segment->purge_expire = 0;
  (segment->purge_mask).mask[0] = 0;
  (segment->purge_mask).mask[1] = 0;
  (segment->purge_mask).mask[2] = 0;
  (segment->purge_mask).mask[3] = 0;
  (segment->purge_mask).mask[4] = 0;
  (segment->purge_mask).mask[5] = 0;
  (segment->purge_mask).mask[6] = 0;
  (segment->purge_mask).mask[7] = 0;
  mi_segments_track_size(size,tld);
  _mi_segment_map_allocated_at(segment);
LAB_004af3d5:
  sVar2 = local_a8;
  if (segment == (mi_segment_t *)0x0) {
    pmVar9 = (mi_segment_t *)0x0;
  }
  else {
    if ((segment->memid).initially_zero == false) {
      memset(&segment->next,0,local_a8 * 0x60 + 200);
    }
    bVar12 = local_38 != 0;
    sVar1 = 0x200;
    if (sVar2 < 0x200) {
      sVar1 = sVar2;
    }
    segment->segment_slices = sVar2;
    segment->segment_info_slices = local_b8;
    mVar6 = _mi_thread_id();
    LOCK();
    segment->thread_id = mVar6;
    UNLOCK();
    segment->cookie = _mi_heap_main.cookie ^ (ulong)segment;
    segment->slice_entries = sVar1;
    segment->kind = (uint)bVar12;
    _mi_stat_increase(&tld->stats->page_committed,segment->segment_info_slices << 0x10);
    pmVar7 = mi_segment_span_allocate(segment,0,local_b8);
    pmVar9 = (mi_segment_t *)0x0;
    if (pmVar7 != (mi_page_t *)0x0) {
      segment->used = 0;
      pmVar9 = segment;
      if (segment->kind == MI_SEGMENT_NORMAL) {
        mi_segment_span_free(segment,local_b8,segment->slice_entries - local_b8,false,tld);
      }
      else {
        pmVar7 = mi_segment_span_allocate(segment,local_b8,sVar2 - local_b8);
        *local_40 = pmVar7;
      }
    }
  }
  return pmVar9;
}

Assistant:

static mi_segment_t* mi_segment_alloc(size_t required, size_t page_alignment, mi_arena_id_t req_arena_id, mi_segments_tld_t* tld, mi_page_t** huge_page)
{
  mi_assert_internal((required==0 && huge_page==NULL) || (required>0 && huge_page != NULL));

  // calculate needed sizes first
  size_t info_slices;
  size_t segment_slices = mi_segment_calculate_slices(required, &info_slices);
  mi_assert_internal(segment_slices > 0 && segment_slices <= UINT32_MAX);

  // Commit eagerly only if not the first N lazy segments (to reduce impact of many threads that allocate just a little)
  const bool eager_delay = (// !_mi_os_has_overcommit() &&             // never delay on overcommit systems
                            _mi_current_thread_count() > 1 &&       // do not delay for the first N threads
                            tld->peak_count < (size_t)mi_option_get(mi_option_eager_commit_delay));
  const bool eager = !eager_delay && mi_option_is_enabled(mi_option_eager_commit);
  bool commit = eager || (required > 0);

  // Allocate the segment from the OS
  mi_segment_t* segment = mi_segment_os_alloc(required, page_alignment, eager_delay, req_arena_id,
                                              &segment_slices, &info_slices, commit, tld);
  if (segment == NULL) return NULL;

  // zero the segment info? -- not always needed as it may be zero initialized from the OS
  if (!segment->memid.initially_zero) {
    ptrdiff_t ofs    = offsetof(mi_segment_t, next);
    size_t    prefix = offsetof(mi_segment_t, slices) - ofs;
    size_t    zsize  = prefix + (sizeof(mi_slice_t) * (segment_slices + 1)); // one more
    _mi_memzero((uint8_t*)segment + ofs, zsize);
  }

  // initialize the rest of the segment info
  const size_t slice_entries = (segment_slices > MI_SLICES_PER_SEGMENT ? MI_SLICES_PER_SEGMENT : segment_slices);
  segment->segment_slices = segment_slices;
  segment->segment_info_slices = info_slices;
  segment->thread_id = _mi_thread_id();
  segment->cookie = _mi_ptr_cookie(segment);
  segment->slice_entries = slice_entries;
  segment->kind = (required == 0 ? MI_SEGMENT_NORMAL : MI_SEGMENT_HUGE);

  // _mi_memzero(segment->slices, sizeof(mi_slice_t)*(info_slices+1));
  _mi_stat_increase(&tld->stats->page_committed, mi_segment_info_size(segment));

  // set up guard pages
  size_t guard_slices = 0;
  if (MI_SECURE>0) {
    // in secure mode, we set up a protected page in between the segment info
    // and the page data, and at the end of the segment.
    size_t os_pagesize = _mi_os_page_size();
    _mi_os_protect((uint8_t*)segment + mi_segment_info_size(segment) - os_pagesize, os_pagesize);
    uint8_t* end = (uint8_t*)segment + mi_segment_size(segment) - os_pagesize;
    mi_segment_ensure_committed(segment, end, os_pagesize);
    _mi_os_protect(end, os_pagesize);
    if (slice_entries == segment_slices) segment->slice_entries--; // don't use the last slice :-(
    guard_slices = 1;
  }

  // reserve first slices for segment info
  mi_page_t* page0 = mi_segment_span_allocate(segment, 0, info_slices);
  mi_assert_internal(page0!=NULL); if (page0==NULL) return NULL; // cannot fail as we always commit in advance
  mi_assert_internal(segment->used == 1);
  segment->used = 0; // don't count our internal slices towards usage

  // initialize initial free pages
  if (segment->kind == MI_SEGMENT_NORMAL) { // not a huge page
    mi_assert_internal(huge_page==NULL);
    mi_segment_span_free(segment, info_slices, segment->slice_entries - info_slices, false /* don't purge */, tld);
  }
  else {
    mi_assert_internal(huge_page!=NULL);
    mi_assert_internal(mi_commit_mask_is_empty(&segment->purge_mask));
    mi_assert_internal(mi_commit_mask_is_full(&segment->commit_mask));
    *huge_page = mi_segment_span_allocate(segment, info_slices, segment_slices - info_slices - guard_slices);
    mi_assert_internal(*huge_page != NULL); // cannot fail as we commit in advance
  }

  mi_assert_expensive(mi_segment_is_valid(segment,tld));
  return segment;
}